

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  int iVar23;
  undefined4 uVar24;
  undefined8 uVar25;
  Scene *pSVar26;
  Geometry *pGVar27;
  long lVar28;
  long lVar29;
  RTCFilterFunctionN p_Var30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar37;
  int iVar38;
  undefined4 uVar39;
  float *vertices;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar40;
  ulong uVar41;
  uint uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  AABBNodeMB4D *node1;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar65;
  float fVar66;
  float fVar73;
  float fVar75;
  undefined1 auVar68 [16];
  float fVar67;
  float fVar74;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar93;
  float fVar94;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar89;
  float fVar95;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar96;
  float fVar101;
  float fVar102;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar103;
  undefined1 auVar100 [16];
  float fVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar109;
  float fVar110;
  float fVar111;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  uint uVar126;
  float fVar127;
  uint uVar128;
  float fVar129;
  uint uVar130;
  float fVar131;
  uint uVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  int iVar154;
  int iVar155;
  int iVar156;
  undefined1 local_1258 [8];
  float fStack_1250;
  undefined4 uStack_124c;
  float fStack_1230;
  float fStack_122c;
  vbool<4> valid;
  Scene *scene;
  undefined1 local_1208 [16];
  undefined1 (*local_11f0) [16];
  StackItemT<embree::NodeRefPtr<4>_> *local_11e8;
  ulong local_11e0;
  ulong local_11d8;
  ulong local_11d0;
  ulong local_11c8;
  ulong local_11c0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1188;
  undefined8 uStack_1180;
  vfloat<4> tNear;
  float local_1118 [4];
  undefined1 local_1108 [16];
  float local_10f8 [4];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  float local_10c8 [4];
  int local_10b8;
  int iStack_10b4;
  int iStack_10b0;
  int iStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined8 local_1048;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar40 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar53 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar104 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar136 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar139 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar67 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar52 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar38 = (tray->tnear).field_0.i[k];
  iVar154 = (tray->tfar).field_0.i[k];
  auVar82._4_4_ = iVar154;
  auVar82._0_4_ = iVar154;
  auVar82._8_4_ = iVar154;
  auVar82._12_4_ = iVar154;
  local_11f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1058 = fVar53;
  fStack_1054 = fVar53;
  fStack_1050 = fVar53;
  fStack_104c = fVar53;
  local_1068 = fVar104;
  fStack_1064 = fVar104;
  fStack_1060 = fVar104;
  fStack_105c = fVar104;
  local_1078 = fVar136;
  fStack_1074 = fVar136;
  fStack_1070 = fVar136;
  fStack_106c = fVar136;
  local_1088 = fVar139;
  fStack_1084 = fVar139;
  fStack_1080 = fVar139;
  fStack_107c = fVar139;
  local_1098 = fVar66;
  fStack_1094 = fVar66;
  fStack_1090 = fVar66;
  fStack_108c = fVar66;
  local_10a8 = fVar67;
  fStack_10a4 = fVar67;
  fStack_10a0 = fVar67;
  fStack_109c = fVar67;
  local_10b8 = iVar38;
  iStack_10b4 = iVar38;
  iStack_10b0 = iVar38;
  iStack_10ac = iVar38;
  iVar156 = iVar38;
  iVar155 = iVar38;
  iVar154 = iVar38;
  fVar115 = fVar67;
  fVar111 = fVar67;
  fVar103 = fVar67;
  fVar102 = fVar66;
  fVar101 = fVar66;
  fVar96 = fVar66;
  fVar95 = fVar139;
  fVar94 = fVar139;
  fVar93 = fVar139;
  fVar86 = fVar136;
  fVar114 = fVar136;
  fVar110 = fVar136;
  fVar78 = fVar104;
  fVar77 = fVar104;
  fVar76 = fVar104;
  fVar75 = fVar53;
  fVar74 = fVar53;
  fVar73 = fVar53;
LAB_0025cd7b:
  do {
    pSVar37 = pSVar40 + -1;
    pSVar40 = pSVar40 + -1;
    if ((float)pSVar37->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar37->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar51 = (pSVar40->ptr).ptr;
      while ((uVar51 & 8) == 0) {
        uVar50 = uVar51 & 0xfffffffffffffff0;
        fVar116 = *(float *)(ray + k * 4 + 0x70);
        pfVar22 = (float *)(uVar50 + 0x80 + uVar45);
        pfVar21 = (float *)(uVar50 + 0x20 + uVar45);
        auVar87._0_4_ = ((*pfVar22 * fVar116 + *pfVar21) - fVar73) * fVar93;
        auVar87._4_4_ = ((pfVar22[1] * fVar116 + pfVar21[1]) - fVar74) * fVar94;
        auVar87._8_4_ = ((pfVar22[2] * fVar116 + pfVar21[2]) - fVar75) * fVar95;
        auVar87._12_4_ = ((pfVar22[3] * fVar116 + pfVar21[3]) - fVar53) * fVar139;
        auVar79._4_4_ = iVar155;
        auVar79._0_4_ = iVar154;
        auVar79._8_4_ = iVar156;
        auVar79._12_4_ = iVar38;
        auVar79 = maxps(auVar79,auVar87);
        pfVar22 = (float *)(uVar50 + 0x80 + uVar48);
        pfVar21 = (float *)(uVar50 + 0x20 + uVar48);
        auVar107._0_4_ = ((*pfVar22 * fVar116 + *pfVar21) - fVar76) * fVar96;
        auVar107._4_4_ = ((pfVar22[1] * fVar116 + pfVar21[1]) - fVar77) * fVar101;
        auVar107._8_4_ = ((pfVar22[2] * fVar116 + pfVar21[2]) - fVar78) * fVar102;
        auVar107._12_4_ = ((pfVar22[3] * fVar116 + pfVar21[3]) - fVar104) * fVar66;
        pfVar22 = (float *)(uVar50 + 0x80 + uVar52);
        pfVar21 = (float *)(uVar50 + 0x20 + uVar52);
        auVar113._0_4_ = ((*pfVar22 * fVar116 + *pfVar21) - fVar110) * fVar103;
        auVar113._4_4_ = ((pfVar22[1] * fVar116 + pfVar21[1]) - fVar114) * fVar111;
        auVar113._8_4_ = ((pfVar22[2] * fVar116 + pfVar21[2]) - fVar86) * fVar115;
        auVar113._12_4_ = ((pfVar22[3] * fVar116 + pfVar21[3]) - fVar136) * fVar67;
        auVar87 = maxps(auVar107,auVar113);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar79,auVar87);
        pfVar22 = (float *)(uVar50 + 0x80 + (uVar45 ^ 0x10));
        pfVar21 = (float *)(uVar50 + 0x20 + (uVar45 ^ 0x10));
        auVar97._0_4_ = ((*pfVar22 * fVar116 + *pfVar21) - fVar73) * fVar93;
        auVar97._4_4_ = ((pfVar22[1] * fVar116 + pfVar21[1]) - fVar74) * fVar94;
        auVar97._8_4_ = ((pfVar22[2] * fVar116 + pfVar21[2]) - fVar75) * fVar95;
        auVar97._12_4_ = ((pfVar22[3] * fVar116 + pfVar21[3]) - fVar53) * fVar139;
        pfVar22 = (float *)(uVar50 + 0x80 + (uVar48 ^ 0x10));
        pfVar21 = (float *)(uVar50 + 0x20 + (uVar48 ^ 0x10));
        auVar105._0_4_ = ((*pfVar22 * fVar116 + *pfVar21) - fVar76) * fVar96;
        auVar105._4_4_ = ((pfVar22[1] * fVar116 + pfVar21[1]) - fVar77) * fVar101;
        auVar105._8_4_ = ((pfVar22[2] * fVar116 + pfVar21[2]) - fVar78) * fVar102;
        auVar105._12_4_ = ((pfVar22[3] * fVar116 + pfVar21[3]) - fVar104) * fVar66;
        pfVar22 = (float *)(uVar50 + 0x80 + (uVar52 ^ 0x10));
        pfVar21 = (float *)(uVar50 + 0x20 + (uVar52 ^ 0x10));
        auVar108._0_4_ = ((*pfVar22 * fVar116 + *pfVar21) - fVar110) * fVar103;
        auVar108._4_4_ = ((pfVar22[1] * fVar116 + pfVar21[1]) - fVar114) * fVar111;
        auVar108._8_4_ = ((pfVar22[2] * fVar116 + pfVar21[2]) - fVar86) * fVar115;
        auVar108._12_4_ = ((pfVar22[3] * fVar116 + pfVar21[3]) - fVar136) * fVar67;
        auVar87 = minps(auVar105,auVar108);
        auVar79 = minps(auVar82,auVar97);
        auVar79 = minps(auVar79,auVar87);
        if (((uint)uVar51 & 7) == 6) {
          bVar31 = (fVar116 < *(float *)(uVar50 + 0xf0) && *(float *)(uVar50 + 0xe0) <= fVar116) &&
                   tNear.field_0._0_4_ <= auVar79._0_4_;
          bVar32 = (fVar116 < *(float *)(uVar50 + 0xf4) && *(float *)(uVar50 + 0xe4) <= fVar116) &&
                   tNear.field_0._4_4_ <= auVar79._4_4_;
          bVar33 = (fVar116 < *(float *)(uVar50 + 0xf8) && *(float *)(uVar50 + 0xe8) <= fVar116) &&
                   tNear.field_0._8_4_ <= auVar79._8_4_;
          bVar34 = (fVar116 < *(float *)(uVar50 + 0xfc) && *(float *)(uVar50 + 0xec) <= fVar116) &&
                   tNear.field_0._12_4_ <= auVar79._12_4_;
        }
        else {
          bVar31 = tNear.field_0._0_4_ <= auVar79._0_4_;
          bVar32 = tNear.field_0._4_4_ <= auVar79._4_4_;
          bVar33 = tNear.field_0._8_4_ <= auVar79._8_4_;
          bVar34 = tNear.field_0._12_4_ <= auVar79._12_4_;
        }
        auVar54._0_4_ = (uint)bVar31 * -0x80000000;
        auVar54._4_4_ = (uint)bVar32 * -0x80000000;
        auVar54._8_4_ = (uint)bVar33 * -0x80000000;
        auVar54._12_4_ = (uint)bVar34 * -0x80000000;
        uVar42 = movmskps((int)root.ptr,auVar54);
        if (uVar42 == 0) {
          root.ptr = (size_t)stack;
          if (pSVar40 == (StackItemT<embree::NodeRefPtr<4>_> *)root.ptr) {
            return;
          }
          goto LAB_0025cd7b;
        }
        uVar42 = uVar42 & 0xff;
        root.ptr = 0;
        if (uVar42 != 0) {
          for (; (uVar42 >> root.ptr & 1) == 0;
              root.ptr = (long)&(((StackItemT<embree::NodeRefPtr<4>_> *)root.ptr)->ptr).ptr + 1) {
          }
        }
        uVar51 = *(ulong *)(uVar50 + root.ptr * 8);
        uVar42 = uVar42 - 1 & uVar42;
        if (uVar42 != 0) {
          uVar126 = tNear.field_0.i[root.ptr];
          lVar43 = 0;
          if (uVar42 != 0) {
            for (; (uVar42 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
            }
          }
          uVar41 = *(ulong *)(uVar50 + lVar43 * 8);
          uVar128 = tNear.field_0.i[lVar43];
          uVar42 = uVar42 - 1 & uVar42;
          root.ptr = (size_t)uVar42;
          if (uVar42 == 0) {
            if (uVar126 < uVar128) {
              (pSVar40->ptr).ptr = uVar41;
              pSVar40->dist = uVar128;
              pSVar40 = pSVar40 + 1;
            }
            else {
              (pSVar40->ptr).ptr = uVar51;
              pSVar40->dist = uVar126;
              pSVar40 = pSVar40 + 1;
              uVar51 = uVar41;
            }
          }
          else {
            auVar80._8_4_ = uVar126;
            auVar80._0_8_ = uVar51;
            auVar80._12_4_ = 0;
            auVar98._8_4_ = uVar128;
            auVar98._0_8_ = uVar41;
            auVar98._12_4_ = 0;
            lVar43 = 0;
            if ((StackItemT<embree::NodeRefPtr<4>_> *)root.ptr !=
                (StackItemT<embree::NodeRefPtr<4>_> *)0x0) {
              for (; (uVar42 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
              }
            }
            uVar25 = *(undefined8 *)(uVar50 + lVar43 * 8);
            iVar23 = tNear.field_0.i[lVar43];
            auVar88._8_4_ = iVar23;
            auVar88._0_8_ = uVar25;
            auVar88._12_4_ = 0;
            auVar55._8_4_ = -(uint)((int)uVar126 < (int)uVar128);
            uVar42 = uVar42 - 1 & uVar42;
            if (uVar42 == 0) {
              auVar55._4_4_ = auVar55._8_4_;
              auVar55._0_4_ = auVar55._8_4_;
              auVar55._12_4_ = auVar55._8_4_;
              auVar106._8_4_ = uVar128;
              auVar106._0_8_ = uVar41;
              auVar106._12_4_ = 0;
              auVar107 = blendvps(auVar106,auVar80,auVar55);
              auVar79 = blendvps(auVar80,auVar98,auVar55);
              auVar56._8_4_ = -(uint)(auVar107._8_4_ < iVar23);
              auVar56._4_4_ = auVar56._8_4_;
              auVar56._0_4_ = auVar56._8_4_;
              auVar56._12_4_ = auVar56._8_4_;
              auVar99._8_4_ = iVar23;
              auVar99._0_8_ = uVar25;
              auVar99._12_4_ = 0;
              auVar87 = blendvps(auVar99,auVar107,auVar56);
              auVar107 = blendvps(auVar107,auVar88,auVar56);
              auVar57._8_4_ = -(uint)(auVar79._8_4_ < auVar107._8_4_);
              auVar57._4_4_ = auVar57._8_4_;
              auVar57._0_4_ = auVar57._8_4_;
              auVar57._12_4_ = auVar57._8_4_;
              SVar89 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar107,auVar79,auVar57);
              SVar81 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar79,auVar107,auVar57);
              *pSVar40 = SVar81;
              pSVar40[1] = SVar89;
              uVar51 = auVar87._0_8_;
              pSVar40 = pSVar40 + 2;
            }
            else {
              root.ptr = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> root.ptr & 1) == 0;
                    root.ptr = (long)&(((StackItemT<embree::NodeRefPtr<4>_> *)root.ptr)->ptr).ptr +
                               1) {
                }
              }
              auVar58._4_4_ = auVar55._8_4_;
              auVar58._0_4_ = auVar55._8_4_;
              auVar58._8_4_ = auVar55._8_4_;
              auVar58._12_4_ = auVar55._8_4_;
              auVar108 = blendvps(auVar98,auVar80,auVar58);
              auVar79 = blendvps(auVar80,auVar98,auVar58);
              auVar112._8_4_ = tNear.field_0.i[root.ptr];
              auVar112._0_8_ = *(undefined8 *)(uVar50 + root.ptr * 8);
              auVar112._12_4_ = 0;
              auVar59._8_4_ = -(uint)(iVar23 < tNear.field_0.i[root.ptr]);
              auVar59._4_4_ = auVar59._8_4_;
              auVar59._0_4_ = auVar59._8_4_;
              auVar59._12_4_ = auVar59._8_4_;
              auVar107 = blendvps(auVar112,auVar88,auVar59);
              auVar87 = blendvps(auVar88,auVar112,auVar59);
              auVar60._8_4_ = -(uint)(auVar79._8_4_ < auVar87._8_4_);
              auVar60._4_4_ = auVar60._8_4_;
              auVar60._0_4_ = auVar60._8_4_;
              auVar60._12_4_ = auVar60._8_4_;
              auVar113 = blendvps(auVar87,auVar79,auVar60);
              SVar81 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar79,auVar87,auVar60);
              auVar61._8_4_ = -(uint)(auVar108._8_4_ < auVar107._8_4_);
              auVar61._4_4_ = auVar61._8_4_;
              auVar61._0_4_ = auVar61._8_4_;
              auVar61._12_4_ = auVar61._8_4_;
              auVar79 = blendvps(auVar107,auVar108,auVar61);
              auVar87 = blendvps(auVar108,auVar107,auVar61);
              auVar62._8_4_ = -(uint)(auVar87._8_4_ < auVar113._8_4_);
              auVar62._4_4_ = auVar62._8_4_;
              auVar62._0_4_ = auVar62._8_4_;
              auVar62._12_4_ = auVar62._8_4_;
              SVar89 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar113,auVar87,auVar62);
              SVar109 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar87,auVar113,auVar62);
              *pSVar40 = SVar81;
              pSVar40[1] = SVar109;
              pSVar40[2] = SVar89;
              uVar51 = auVar79._0_8_;
              pSVar40 = pSVar40 + 3;
            }
          }
        }
      }
      local_11e8 = (StackItemT<embree::NodeRefPtr<4>_> *)((ulong)((uint)uVar51 & 0xf) - 8);
      if (local_11e8 != (StackItemT<embree::NodeRefPtr<4>_> *)0x0) {
        uVar51 = uVar51 & 0xfffffffffffffff0;
        root.ptr = 0;
        do {
          lVar43 = root.ptr * 0x50;
          pSVar26 = context->scene;
          pGVar27 = (pSVar26->geometries).items[*(uint *)(uVar51 + 0x30 + lVar43)].ptr;
          fVar53 = (pGVar27->time_range).lower;
          fVar104 = ((*(float *)(ray + k * 4 + 0x70) - fVar53) /
                    ((pGVar27->time_range).upper - fVar53)) * pGVar27->fnumTimeSegments;
          auVar68 = roundss(ZEXT416((uint)fVar53),ZEXT416((uint)fVar104),9);
          fVar53 = pGVar27->fnumTimeSegments + -1.0;
          if (fVar53 <= auVar68._0_4_) {
            auVar68._0_4_ = fVar53;
          }
          fVar53 = 0.0;
          if (0.0 <= auVar68._0_4_) {
            fVar53 = auVar68._0_4_;
          }
          uVar47 = (ulong)*(uint *)(uVar51 + 4 + lVar43);
          lVar28 = *(long *)(*(long *)&pGVar27[2].numPrimitives + (long)(int)fVar53 * 0x38);
          lVar29 = *(long *)(*(long *)&pGVar27[2].numPrimitives + 0x38 + (long)(int)fVar53 * 0x38);
          pfVar21 = (float *)(lVar28 + (ulong)*(uint *)(uVar51 + lVar43) * 4);
          uVar44 = (ulong)*(uint *)(uVar51 + 0x10 + lVar43);
          pfVar22 = (float *)(lVar28 + uVar44 * 4);
          uVar50 = (ulong)*(uint *)(uVar51 + 0x20 + lVar43);
          puVar1 = (undefined8 *)(lVar28 + uVar50 * 4);
          uVar25 = *puVar1;
          pfVar2 = (float *)(lVar28 + uVar47 * 4);
          local_11c8 = (ulong)*(uint *)(uVar51 + 0x14 + lVar43);
          pfVar3 = (float *)(lVar28 + local_11c8 * 4);
          uVar41 = (ulong)*(uint *)(uVar51 + 0x24 + lVar43);
          pfVar4 = (float *)(lVar28 + uVar41 * 4);
          uVar46 = (ulong)*(uint *)(uVar51 + 8 + lVar43);
          local_11e0 = (ulong)*(uint *)(uVar51 + 0x18 + lVar43);
          pfVar5 = (float *)(lVar28 + local_11e0 * 4);
          local_11c0 = (ulong)*(uint *)(uVar51 + 0x28 + lVar43);
          pfVar6 = (float *)(lVar28 + local_11c0 * 4);
          uVar49 = (ulong)*(uint *)(uVar51 + 0xc + lVar43);
          local_11d8 = (ulong)*(uint *)(uVar51 + 0x1c + lVar43);
          pfVar7 = (float *)(lVar28 + local_11d8 * 4);
          uVar42 = *(uint *)(uVar51 + 0x2c + lVar43);
          local_11d0 = (ulong)uVar42;
          pfVar8 = (float *)(lVar28 + local_11d0 * 4);
          pfVar9 = (float *)(lVar29 + (ulong)*(uint *)(uVar51 + lVar43) * 4);
          pfVar10 = (float *)(lVar29 + uVar44 * 4);
          fVar104 = fVar104 - fVar53;
          pfVar11 = (float *)(lVar29 + uVar47 * 4);
          pfVar12 = (float *)(lVar29 + uVar46 * 4);
          local_1028 = pfVar22[2];
          fStack_1024 = pfVar3[2];
          fStack_1020 = pfVar5[2];
          fStack_101c = pfVar7[2];
          local_1258._0_4_ = (undefined4)uVar25;
          local_1258._4_4_ = (undefined4)((ulong)uVar25 >> 0x20);
          fStack_1250 = (float)puVar1[1];
          pfVar13 = (float *)(lVar29 + uVar49 * 4);
          local_1048 = CONCAT44(*pfVar4,local_1258._0_4_);
          _local_1038 = CONCAT44(*pfVar8,*pfVar6);
          pfVar14 = (float *)(lVar29 + local_11e0 * 4);
          pfVar15 = (float *)(lVar29 + local_11c8 * 4);
          pfVar16 = (float *)(lVar29 + local_11d8 * 4);
          pfVar17 = (float *)(lVar29 + uVar50 * 4);
          pfVar18 = (float *)(lVar29 + local_11c0 * 4);
          pfVar19 = (float *)(lVar29 + uVar41 * 4);
          pfVar20 = (float *)(lVar29 + local_11d0 * 4);
          fVar53 = 1.0 - fVar104;
          fVar110 = *pfVar21 * fVar53 + *pfVar9 * fVar104;
          fVar114 = *pfVar2 * fVar53 + *pfVar11 * fVar104;
          fVar116 = fStack_1230 * fVar53 + *pfVar12 * fVar104;
          fVar118 = fStack_122c * fVar53 + *pfVar13 * fVar104;
          fVar66 = pfVar21[1] * fVar53 + pfVar9[1] * fVar104;
          fVar73 = pfVar2[1] * fVar53 + pfVar11[1] * fVar104;
          fVar75 = *(float *)(lVar28 + uVar46 * 4 + 4) * fVar53 + pfVar12[1] * fVar104;
          fVar77 = *(float *)(lVar28 + uVar49 * 4 + 4) * fVar53 + pfVar13[1] * fVar104;
          fVar111 = *pfVar6 * fVar53 + pfVar9[2] * fVar104;
          fVar115 = *pfVar8 * fVar53 + pfVar11[2] * fVar104;
          fVar117 = fStack_1030 * fVar53 + pfVar12[2] * fVar104;
          fVar119 = fStack_102c * fVar53 + pfVar13[2] * fVar104;
          puVar1 = (undefined8 *)(uVar51 + 0x30 + lVar43);
          local_1018 = *puVar1;
          uStack_1010 = puVar1[1];
          puVar1 = (undefined8 *)(uVar51 + 0x40 + lVar43);
          local_1188 = *puVar1;
          uStack_1180 = puVar1[1];
          fVar86 = fVar110 - (*pfVar22 * fVar53 + *pfVar10 * fVar104);
          fVar93 = fVar114 - (*pfVar3 * fVar53 + *pfVar15 * fVar104);
          fVar94 = fVar116 - (*pfVar5 * fVar53 + *pfVar14 * fVar104);
          fVar95 = fVar118 - (*pfVar7 * fVar53 + *pfVar16 * fVar104);
          fVar137 = fVar66 - (pfVar22[1] * fVar53 + pfVar10[1] * fVar104);
          fVar140 = fVar73 - (pfVar3[1] * fVar53 + pfVar15[1] * fVar104);
          fVar142 = fVar75 - (pfVar5[1] * fVar53 + pfVar14[1] * fVar104);
          fVar144 = fVar77 - (pfVar7[1] * fVar53 + pfVar16[1] * fVar104);
          fVar146 = fVar111 - (pfVar22[2] * fVar53 + pfVar10[2] * fVar104);
          fVar147 = fVar115 - (pfVar3[2] * fVar53 + pfVar15[2] * fVar104);
          fVar148 = fVar117 - (pfVar5[2] * fVar53 + pfVar14[2] * fVar104);
          fVar149 = fVar119 - (pfVar7[2] * fVar53 + pfVar16[2] * fVar104);
          fVar67 = ((float)local_1258._0_4_ * fVar53 + *pfVar17 * fVar104) - fVar110;
          fVar74 = (*pfVar4 * fVar53 + *pfVar19 * fVar104) - fVar114;
          fVar76 = (fStack_1040 * fVar53 + *pfVar18 * fVar104) - fVar116;
          fVar78 = (fStack_103c * fVar53 + *pfVar20 * fVar104) - fVar118;
          fVar96 = ((float)local_1258._4_4_ * fVar53 + pfVar17[1] * fVar104) - fVar66;
          fVar101 = (pfVar4[1] * fVar53 + pfVar19[1] * fVar104) - fVar73;
          fVar102 = (pfVar6[1] * fVar53 + pfVar18[1] * fVar104) - fVar75;
          fVar103 = (pfVar8[1] * fVar53 + pfVar20[1] * fVar104) - fVar77;
          fVar125 = (fVar53 * fStack_1250 + fVar104 * pfVar17[2]) - fVar111;
          fVar127 = (fVar53 * pfVar4[2] + fVar104 * pfVar19[2]) - fVar115;
          fVar129 = (fVar53 * pfVar6[2] + fVar104 * pfVar18[2]) - fVar117;
          fVar131 = (fVar53 * pfVar8[2] + fVar104 * pfVar20[2]) - fVar119;
          fVar120 = fVar146 * fVar96 - fVar137 * fVar125;
          fVar121 = fVar147 * fVar101 - fVar140 * fVar127;
          local_10e8._4_4_ = fVar121;
          local_10e8._0_4_ = fVar120;
          fVar122 = fVar148 * fVar102 - fVar142 * fVar129;
          fVar123 = fVar149 * fVar103 - fVar144 * fVar131;
          fVar53 = *(float *)(ray + k * 4);
          fVar104 = *(float *)(ray + k * 4 + 0x10);
          fVar136 = *(float *)(ray + k * 4 + 0x40);
          fVar139 = *(float *)(ray + k * 4 + 0x50);
          fVar110 = fVar110 - fVar53;
          fVar114 = fVar114 - fVar53;
          fStack_1230 = fVar116 - fVar53;
          fStack_122c = fVar118 - fVar53;
          fVar66 = fVar66 - fVar104;
          fVar73 = fVar73 - fVar104;
          fVar75 = fVar75 - fVar104;
          fVar77 = fVar77 - fVar104;
          fVar150 = fVar110 * fVar139 - fVar66 * fVar136;
          fVar151 = fVar114 * fVar139 - fVar73 * fVar136;
          fVar152 = fStack_1230 * fVar139 - fVar75 * fVar136;
          fVar153 = fStack_122c * fVar139 - fVar77 * fVar136;
          local_10d8._0_4_ = fVar86 * fVar125 - fVar146 * fVar67;
          local_10d8._4_4_ = fVar93 * fVar127 - fVar147 * fVar74;
          local_10d8._8_4_ = fVar94 * fVar129 - fVar148 * fVar76;
          local_10d8._12_4_ = fVar95 * fVar131 - fVar149 * fVar78;
          fVar53 = *(float *)(ray + k * 4 + 0x20);
          fVar104 = *(float *)(ray + k * 4 + 0x60);
          fVar111 = fVar111 - fVar53;
          fVar115 = fVar115 - fVar53;
          fVar117 = fVar117 - fVar53;
          fVar119 = fVar119 - fVar53;
          local_10e8._8_4_ = fVar122;
          local_10e8._12_4_ = fVar123;
          fVar53 = fVar111 * fVar136 - fVar110 * fVar104;
          fVar116 = fVar115 * fVar136 - fVar114 * fVar104;
          fVar118 = fVar117 * fVar136 - fStack_1230 * fVar104;
          fVar124 = fVar119 * fVar136 - fStack_122c * fVar104;
          local_10c8[0] = fVar137 * fVar67 - fVar86 * fVar96;
          local_10c8[1] = fVar140 * fVar74 - fVar93 * fVar101;
          local_10c8[2] = fVar142 * fVar76 - fVar94 * fVar102;
          local_10c8[3] = fVar144 * fVar78 - fVar95 * fVar103;
          fVar138 = fVar66 * fVar104 - fVar111 * fVar139;
          fVar141 = fVar73 * fVar104 - fVar115 * fVar139;
          fVar143 = fVar75 * fVar104 - fVar117 * fVar139;
          fVar145 = fVar77 * fVar104 - fVar119 * fVar139;
          fVar133 = fVar136 * fVar120 + fVar139 * local_10d8._0_4_ + fVar104 * local_10c8[0];
          fVar134 = fVar136 * fVar121 + fVar139 * local_10d8._4_4_ + fVar104 * local_10c8[1];
          fVar135 = fVar136 * fVar122 + fVar139 * local_10d8._8_4_ + fVar104 * local_10c8[2];
          fVar136 = fVar136 * fVar123 + fVar139 * local_10d8._12_4_ + fVar104 * local_10c8[3];
          uVar126 = (uint)fVar133 & 0x80000000;
          uVar128 = (uint)fVar134 & 0x80000000;
          uVar130 = (uint)fVar135 & 0x80000000;
          uVar132 = (uint)fVar136 & 0x80000000;
          tNear.field_0.i[0] =
               (uint)(fVar67 * fVar138 + fVar96 * fVar53 + fVar125 * fVar150) ^ uVar126;
          tNear.field_0.i[1] =
               (uint)(fVar74 * fVar141 + fVar101 * fVar116 + fVar127 * fVar151) ^ uVar128;
          tNear.field_0.i[2] =
               (uint)(fVar76 * fVar143 + fVar102 * fVar118 + fVar129 * fVar152) ^ uVar130;
          tNear.field_0.i[3] =
               (uint)(fVar78 * fVar145 + fVar103 * fVar124 + fVar131 * fVar153) ^ uVar132;
          fVar139 = (float)((uint)(fVar138 * fVar86 + fVar53 * fVar137 + fVar150 * fVar146) ^
                           uVar126);
          fVar67 = (float)((uint)(fVar141 * fVar93 + fVar116 * fVar140 + fVar151 * fVar147) ^
                          uVar128);
          fVar74 = (float)((uint)(fVar143 * fVar94 + fVar118 * fVar142 + fVar152 * fVar148) ^
                          uVar130);
          fVar76 = (float)((uint)(fVar145 * fVar95 + fVar124 * fVar144 + fVar153 * fVar149) ^
                          uVar132);
          fVar53 = ABS(fVar133);
          fVar104 = ABS(fVar134);
          auVar90._0_8_ = CONCAT44(fVar134,fVar133) & 0x7fffffff7fffffff;
          auVar90._8_4_ = ABS(fVar135);
          auVar90._12_4_ = ABS(fVar136);
          bVar33 = tNear.field_0.v[0] + fVar139 <= fVar53 &&
                   ((0.0 <= fVar139 && 0.0 <= tNear.field_0.v[0]) && fVar133 != 0.0);
          auVar100._0_4_ = -(uint)bVar33;
          bVar34 = tNear.field_0.v[1] + fVar67 <= fVar104 &&
                   ((0.0 <= fVar67 && 0.0 <= tNear.field_0.v[1]) && fVar134 != 0.0);
          auVar100._4_4_ = -(uint)bVar34;
          bVar32 = tNear.field_0.v[2] + fVar74 <= auVar90._8_4_ &&
                   ((0.0 <= fVar74 && 0.0 <= tNear.field_0.v[2]) && fVar135 != 0.0);
          auVar100._8_4_ = -(uint)bVar32;
          bVar31 = tNear.field_0.v[3] + fVar76 <= auVar90._12_4_ &&
                   ((0.0 <= fVar76 && 0.0 <= tNear.field_0.v[3]) && fVar136 != 0.0);
          auVar100._12_4_ = -(uint)bVar31;
          iVar38 = movmskps(uVar42,auVar100);
          if (iVar38 != 0) {
            fVar66 = (float)(uVar126 ^
                            (uint)(fVar110 * fVar120 +
                                  fVar66 * local_10d8._0_4_ + fVar111 * local_10c8[0]));
            fVar73 = (float)(uVar128 ^
                            (uint)(fVar114 * fVar121 +
                                  fVar73 * local_10d8._4_4_ + fVar115 * local_10c8[1]));
            fVar75 = (float)(uVar130 ^
                            (uint)(fStack_1230 * fVar122 +
                                  fVar75 * local_10d8._8_4_ + fVar117 * local_10c8[2]));
            fVar77 = (float)(uVar132 ^
                            (uint)(fStack_122c * fVar123 +
                                  fVar77 * local_10d8._12_4_ + fVar119 * local_10c8[3]));
            fVar136 = *(float *)(ray + k * 4 + 0x30);
            local_1258._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
            local_1258._4_4_ = 0;
            fStack_1250 = 0.0;
            uStack_124c = 0;
            valid.field_0.i[0] =
                 -(uint)((fVar66 <= (float)local_1258._0_4_ * fVar53 && fVar136 * fVar53 < fVar66)
                        && bVar33);
            valid.field_0.i[1] =
                 -(uint)((fVar73 <= (float)local_1258._0_4_ * fVar104 && fVar136 * fVar104 < fVar73)
                        && bVar34);
            valid.field_0.i[2] =
                 -(uint)((fVar75 <= (float)local_1258._0_4_ * auVar90._8_4_ &&
                         fVar136 * auVar90._8_4_ < fVar75) && bVar32);
            valid.field_0.i[3] =
                 -(uint)((fVar77 <= (float)local_1258._0_4_ * auVar90._12_4_ &&
                         fVar136 * auVar90._12_4_ < fVar77) && bVar31);
            iVar38 = movmskps(iVar38,(undefined1  [16])valid.field_0);
            if (iVar38 != 0) {
              auVar82 = rcpps(local_10e8,auVar90);
              fVar136 = auVar82._0_4_;
              fVar78 = auVar82._4_4_;
              fVar110 = auVar82._8_4_;
              fVar114 = auVar82._12_4_;
              fVar136 = (1.0 - fVar53 * fVar136) * fVar136 + fVar136;
              fVar78 = (1.0 - fVar104 * fVar78) * fVar78 + fVar78;
              fVar110 = (1.0 - auVar90._8_4_ * fVar110) * fVar110 + fVar110;
              fVar114 = (1.0 - auVar90._12_4_ * fVar114) * fVar114 + fVar114;
              fVar66 = fVar66 * fVar136;
              fVar73 = fVar73 * fVar78;
              fVar75 = fVar75 * fVar110;
              fVar77 = fVar77 * fVar114;
              local_10f8[0] = fVar66;
              local_10f8[1] = fVar73;
              local_10f8[2] = fVar75;
              local_10f8[3] = fVar77;
              local_1118[0] = tNear.field_0.v[0] * fVar136;
              local_1118[1] = tNear.field_0.v[1] * fVar78;
              local_1118[2] = tNear.field_0.v[2] * fVar110;
              local_1118[3] = tNear.field_0.v[3] * fVar114;
              local_1108._0_4_ = fVar136 * fVar139;
              local_1108._4_4_ = fVar78 * fVar67;
              local_1108._8_4_ = fVar110 * fVar74;
              local_1108._12_4_ = fVar114 * fVar76;
              auVar35._4_4_ = fVar73;
              auVar35._0_4_ = fVar66;
              auVar35._8_4_ = fVar75;
              auVar35._12_4_ = fVar77;
              auVar79 = blendvps(_DAT_01f7a9f0,auVar35,(undefined1  [16])valid.field_0);
              auVar91._4_4_ = auVar79._0_4_;
              auVar91._0_4_ = auVar79._4_4_;
              auVar91._8_4_ = auVar79._12_4_;
              auVar91._12_4_ = auVar79._8_4_;
              auVar82 = minps(auVar91,auVar79);
              auVar69._0_8_ = auVar82._8_8_;
              auVar69._8_4_ = auVar82._0_4_;
              auVar69._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar69,auVar82);
              uVar42 = -(uint)(auVar82._0_4_ == auVar79._0_4_);
              uVar126 = -(uint)(auVar82._4_4_ == auVar79._4_4_);
              uVar128 = -(uint)(auVar82._8_4_ == auVar79._8_4_);
              uVar130 = -(uint)(auVar82._12_4_ == auVar79._12_4_);
              auVar85._4_4_ = uVar126;
              auVar85._0_4_ = uVar42;
              auVar83._0_4_ = uVar42 & valid.field_0.i[0];
              auVar83._4_4_ = uVar126 & valid.field_0.i[1];
              auVar83._8_4_ = uVar128 & valid.field_0.i[2];
              auVar83._12_4_ = uVar130 & valid.field_0.i[3];
              iVar38 = movmskps(iVar38,auVar83);
              auVar84._8_4_ = 0xffffffff;
              auVar84._0_8_ = 0xffffffffffffffff;
              auVar84._12_4_ = 0xffffffff;
              if (iVar38 != 0) {
                auVar85._8_4_ = uVar128;
                auVar85._12_4_ = uVar130;
                auVar84 = auVar85;
              }
              auVar63._0_4_ = valid.field_0.i[0] & auVar84._0_4_;
              auVar63._4_4_ = valid.field_0.i[1] & auVar84._4_4_;
              auVar63._8_4_ = valid.field_0.i[2] & auVar84._8_4_;
              auVar63._12_4_ = valid.field_0.i[3] & auVar84._12_4_;
              uVar42 = movmskps(iVar38,auVar63);
              uVar50 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
LAB_0025d736:
              uVar42 = *(uint *)((long)&local_1018 + uVar50 * 4);
              uVar41 = (ulong)uVar42;
              pGVar27 = (pSVar26->geometries).items[uVar41].ptr;
              if ((pGVar27->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[uVar50] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar27->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar53 = local_1118[uVar50];
                  fVar104 = local_10f8[uVar50 - 4];
                  *(float *)(ray + k * 4 + 0x80) = local_10f8[uVar50];
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10e8 + uVar50 * 4);
                  *(float *)(ray + k * 4 + 0xd0) = local_10c8[uVar50 - 4];
                  *(float *)(ray + k * 4 + 0xe0) = local_10c8[uVar50];
                  *(float *)(ray + k * 4 + 0xf0) = fVar53;
                  *(float *)(ray + k * 4 + 0x100) = fVar104;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_1188 + uVar50 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar42;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_0025d5f9;
                }
                h.u.field_0.v[0] = local_1118[uVar50];
                h.v.field_0.v[0] = local_10f8[uVar50 - 4];
                uVar39 = *(undefined4 *)(local_10e8 + uVar50 * 4);
                fVar53 = local_10c8[uVar50 - 4];
                h.geomID.field_0.i[1] = uVar42;
                h.geomID.field_0.i[0] = uVar42;
                h.geomID.field_0.i[2] = uVar42;
                h.geomID.field_0.i[3] = uVar42;
                uVar24 = *(undefined4 *)((long)&local_1188 + uVar50 * 4);
                h.primID.field_0.i[1] = uVar24;
                h.primID.field_0.i[0] = uVar24;
                h.primID.field_0.i[2] = uVar24;
                h.primID.field_0.i[3] = uVar24;
                h.Ng.field_0._4_4_ = uVar39;
                h.Ng.field_0._0_4_ = uVar39;
                h.Ng.field_0._8_4_ = uVar39;
                h.Ng.field_0._12_4_ = uVar39;
                h.Ng.field_0._20_4_ = (int)fVar53;
                h.Ng.field_0._16_4_ = (int)fVar53;
                h.Ng.field_0._24_4_ = (int)fVar53;
                h.Ng.field_0._28_4_ = (int)fVar53;
                fVar53 = local_10c8[uVar50];
                h.Ng.field_0._36_4_ = (int)fVar53;
                h.Ng.field_0._32_4_ = (int)fVar53;
                h.Ng.field_0._40_4_ = (int)fVar53;
                h.Ng.field_0._44_4_ = (int)fVar53;
                h.u.field_0.v[1] = h.u.field_0.v[0];
                h.u.field_0.v[2] = h.u.field_0.v[0];
                h.u.field_0.v[3] = h.u.field_0.v[0];
                h.v.field_0.v[1] = h.v.field_0.v[0];
                h.v.field_0.v[2] = h.v.field_0.v[0];
                h.v.field_0.v[3] = h.v.field_0.v[0];
                h.instID[0].field_0.i[0] = context->user->instID[0];
                h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
                h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
                h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
                h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                *(float *)(ray + k * 4 + 0x80) = local_10f8[uVar50];
                local_1208 = *local_11f0;
                args.valid = (int *)local_1208;
                args.geometryUserPtr = pGVar27->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)&h;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar27->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar27->intersectionFilterN)(&args);
                }
                if (local_1208 == (undefined1  [16])0x0) {
                  auVar70._8_4_ = 0xffffffff;
                  auVar70._0_8_ = 0xffffffffffffffff;
                  auVar70._12_4_ = 0xffffffff;
                  auVar70 = auVar70 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var30 = context->args->filter;
                  if ((p_Var30 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar27->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var30)(&args);
                  }
                  auVar64._0_4_ = -(uint)(local_1208._0_4_ == 0);
                  auVar64._4_4_ = -(uint)(local_1208._4_4_ == 0);
                  auVar64._8_4_ = -(uint)(local_1208._8_4_ == 0);
                  auVar64._12_4_ = -(uint)(local_1208._12_4_ == 0);
                  auVar70 = auVar64 ^ _DAT_01f7ae20;
                  if (local_1208 != (undefined1  [16])0x0) {
                    auVar82 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar64);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar64);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar64);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar64);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar64);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar64);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar64);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar64);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar64);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar82;
                  }
                }
                if ((_DAT_01f7bb20 & auVar70) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_1258._0_4_;
                }
                else {
                  _local_1258 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                valid.field_0.v[uVar50] = 0.0;
                valid.field_0.i[0] = -(uint)(fVar66 <= (float)local_1258._0_4_) & valid.field_0.i[0]
                ;
                valid.field_0.i[1] = -(uint)(fVar73 <= (float)local_1258._0_4_) & valid.field_0.i[1]
                ;
                valid.field_0.i[2] = -(uint)(fVar75 <= (float)local_1258._0_4_) & valid.field_0.i[2]
                ;
                valid.field_0.i[3] = -(uint)(fVar77 <= (float)local_1258._0_4_) & valid.field_0.i[3]
                ;
                uVar41 = uVar50;
                fStack_1230 = fVar75;
                fStack_122c = fVar77;
              }
              iVar38 = movmskps((int)uVar41,(undefined1  [16])valid.field_0);
              if (iVar38 == 0) goto LAB_0025d5f9;
              auVar36._4_4_ = fVar73;
              auVar36._0_4_ = fVar66;
              auVar36._8_4_ = fVar75;
              auVar36._12_4_ = fVar77;
              auVar79 = blendvps(_DAT_01f7a9f0,auVar36,(undefined1  [16])valid.field_0);
              auVar92._4_4_ = auVar79._0_4_;
              auVar92._0_4_ = auVar79._4_4_;
              auVar92._8_4_ = auVar79._12_4_;
              auVar92._12_4_ = auVar79._8_4_;
              auVar82 = minps(auVar92,auVar79);
              auVar71._0_8_ = auVar82._8_8_;
              auVar71._8_4_ = auVar82._0_4_;
              auVar71._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar71,auVar82);
              auVar72._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar79._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar82._0_4_ == auVar79._0_4_) & valid.field_0._0_4_);
              auVar72._8_4_ = -(uint)(auVar82._8_4_ == auVar79._8_4_) & valid.field_0._8_4_;
              auVar72._12_4_ = -(uint)(auVar82._12_4_ == auVar79._12_4_) & valid.field_0._12_4_;
              iVar38 = movmskps(iVar38,auVar72);
              aVar65 = valid.field_0;
              if (iVar38 != 0) {
                aVar65.i[2] = auVar72._8_4_;
                aVar65._0_8_ = auVar72._0_8_;
                aVar65.i[3] = auVar72._12_4_;
              }
              uVar39 = movmskps(iVar38,(undefined1  [16])aVar65);
              uVar41 = CONCAT44((int)(uVar41 >> 0x20),uVar39);
              uVar50 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              goto LAB_0025d736;
            }
          }
LAB_0025d5f9:
          root.ptr = (long)&(((StackItemT<embree::NodeRefPtr<4>_> *)root.ptr)->ptr).ptr + 1;
        } while ((StackItemT<embree::NodeRefPtr<4>_> *)root.ptr != local_11e8);
      }
      uVar39 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar82._4_4_ = uVar39;
      auVar82._0_4_ = uVar39;
      auVar82._8_4_ = uVar39;
      auVar82._12_4_ = uVar39;
      fVar73 = local_1058;
      fVar74 = fStack_1054;
      fVar75 = fStack_1050;
      fVar53 = fStack_104c;
      fVar76 = local_1068;
      fVar77 = fStack_1064;
      fVar78 = fStack_1060;
      fVar104 = fStack_105c;
      fVar110 = local_1078;
      fVar114 = fStack_1074;
      fVar86 = fStack_1070;
      fVar136 = fStack_106c;
      fVar93 = local_1088;
      fVar94 = fStack_1084;
      fVar95 = fStack_1080;
      fVar139 = fStack_107c;
      fVar96 = local_1098;
      fVar101 = fStack_1094;
      fVar102 = fStack_1090;
      fVar66 = fStack_108c;
      fVar103 = local_10a8;
      fVar111 = fStack_10a4;
      fVar115 = fStack_10a0;
      fVar67 = fStack_109c;
      iVar154 = local_10b8;
      iVar155 = iStack_10b4;
      iVar156 = iStack_10b0;
      iVar38 = iStack_10ac;
    }
    if (pSVar40 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }